

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS
ref_gather_node_scalar_txt
          (REF_NODE ref_node,REF_INT ldim,REF_DBL *scalar,char *separator,REF_BOOL prepend_xyz,
          FILE *file)

{
  uint uVar1;
  double local_b8;
  int local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS status;
  REF_INT nxyz;
  REF_INT im;
  REF_INT i;
  REF_INT n;
  REF_INT local;
  REF_GLOB first;
  REF_GLOB nnode_written;
  REF_GLOB global;
  REF_DBL *xyzm;
  REF_DBL *local_xyzm;
  REF_MPI pRStack_48;
  REF_INT chunk;
  REF_MPI ref_mpi;
  FILE *file_local;
  char *pcStack_30;
  REF_BOOL prepend_xyz_local;
  char *separator_local;
  REF_DBL *scalar_local;
  REF_NODE pRStack_18;
  REF_INT ldim_local;
  REF_NODE ref_node_local;
  
  pRStack_48 = ref_node->ref_mpi;
  ref_private_macro_code_rxs = 0;
  if (prepend_xyz != 0) {
    ref_private_macro_code_rxs = 3;
  }
  local_a4 = (int)(ref_node->old_n_global / (long)pRStack_48->n) + 1;
  if (pRStack_48->reduce_byte_limit < 1) {
    local_a0 = 0x7fffffff;
  }
  else {
    local_a0 = pRStack_48->reduce_byte_limit / ((ref_private_macro_code_rxs + ldim + 1) * 8);
  }
  if (local_a0 <= local_a4) {
    if (pRStack_48->reduce_byte_limit < 1) {
      local_a8 = 0x7fffffff;
    }
    else {
      local_a8 = pRStack_48->reduce_byte_limit / ((ref_private_macro_code_rxs + ldim + 1) * 8);
    }
    local_a4 = local_a8;
  }
  local_xyzm._4_4_ = local_a4;
  ref_mpi = (REF_MPI)file;
  file_local._4_4_ = prepend_xyz;
  pcStack_30 = separator;
  separator_local = (char *)scalar;
  scalar_local._4_4_ = ldim;
  pRStack_18 = ref_node;
  if ((ref_private_macro_code_rxs + ldim + 1) * local_a4 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x6d9,
           "ref_gather_node_scalar_txt","malloc local_xyzm of REF_DBL negative");
    ref_node_local._4_4_ = 1;
  }
  else {
    xyzm = (REF_DBL *)malloc((long)((ref_private_macro_code_rxs + ldim + 1) * local_a4) << 3);
    if (xyzm == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x6d9,"ref_gather_node_scalar_txt","malloc local_xyzm of REF_DBL NULL");
      ref_node_local._4_4_ = 2;
    }
    else if ((ref_private_macro_code_rxs + scalar_local._4_4_ + 1) * local_xyzm._4_4_ < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x6da,"ref_gather_node_scalar_txt","malloc xyzm of REF_DBL negative");
      ref_node_local._4_4_ = 1;
    }
    else {
      global = (REF_GLOB)
               malloc((long)((ref_private_macro_code_rxs + scalar_local._4_4_ + 1) *
                            local_xyzm._4_4_) << 3);
      if ((void *)global == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x6da,"ref_gather_node_scalar_txt","malloc xyzm of REF_DBL NULL");
        ref_node_local._4_4_ = 2;
      }
      else {
        first = 0;
        while (first < pRStack_18->old_n_global) {
          _n = first;
          if ((long)local_xyzm._4_4_ < pRStack_18->old_n_global - first) {
            local_b0 = local_xyzm._4_4_;
          }
          else {
            local_b0 = (int)pRStack_18->old_n_global - (int)first;
          }
          first = local_b0 + first;
          for (nxyz = 0;
              nxyz < (ref_private_macro_code_rxs + scalar_local._4_4_ + 1) * local_xyzm._4_4_;
              nxyz = nxyz + 1) {
            xyzm[nxyz] = 0.0;
          }
          for (nxyz = 0; nxyz < local_b0; nxyz = nxyz + 1) {
            nnode_written = _n + nxyz;
            uVar1 = ::ref_node_local(pRStack_18,nnode_written,&i);
            if ((uVar1 != 0) && (uVar1 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x6e9,"ref_gather_node_scalar_txt",(ulong)uVar1,"node local failed");
              return uVar1;
            }
            if ((uVar1 == 0) && (pRStack_48->id == pRStack_18->part[i])) {
              for (status = 0; status < ref_private_macro_code_rxs; status = status + 1) {
                xyzm[status + (ref_private_macro_code_rxs + scalar_local._4_4_ + 1) * nxyz] =
                     pRStack_18->real[status + i * 0xf];
              }
              for (status = 0; status < scalar_local._4_4_; status = status + 1) {
                xyzm[ref_private_macro_code_rxs + status +
                     (ref_private_macro_code_rxs + scalar_local._4_4_ + 1) * nxyz] =
                     *(REF_DBL *)(separator_local + (long)(status + scalar_local._4_4_ * i) * 8);
              }
              xyzm[ref_private_macro_code_rxs + scalar_local._4_4_ +
                   (ref_private_macro_code_rxs + scalar_local._4_4_ + 1) * nxyz] = 1.0;
            }
            else {
              for (status = 0; status < ref_private_macro_code_rxs + scalar_local._4_4_ + 1;
                  status = status + 1) {
                xyzm[status + (ref_private_macro_code_rxs + scalar_local._4_4_ + 1) * nxyz] = 0.0;
              }
            }
          }
          uVar1 = ref_mpi_sum(pRStack_48,xyzm,(void *)global,
                              (ref_private_macro_code_rxs + scalar_local._4_4_ + 1) * local_b0,3);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x6fb,"ref_gather_node_scalar_txt",(ulong)uVar1,"sum");
            return uVar1;
          }
          if (pRStack_48->id == 0) {
            for (nxyz = 0; nxyz < local_b0; nxyz = nxyz + 1) {
              if (*(double *)
                   (global + (long)(ref_private_macro_code_rxs + scalar_local._4_4_ +
                                   (ref_private_macro_code_rxs + scalar_local._4_4_ + 1) * nxyz) * 8
                   ) - 1.0 <= 0.0) {
                local_b8 = -(*(double *)
                              (global + (long)(ref_private_macro_code_rxs + scalar_local._4_4_ +
                                              (ref_private_macro_code_rxs + scalar_local._4_4_ + 1)
                                              * nxyz) * 8) - 1.0);
              }
              else {
                local_b8 = *(double *)
                            (global + (long)(ref_private_macro_code_rxs + scalar_local._4_4_ +
                                            (ref_private_macro_code_rxs + scalar_local._4_4_ + 1) *
                                            nxyz) * 8) - 1.0;
              }
              if (0.1 < local_b8) {
                printf("error gather node %ld %f\n",
                       *(undefined8 *)
                        (global + (long)(ref_private_macro_code_rxs + scalar_local._4_4_ +
                                        (ref_private_macro_code_rxs + scalar_local._4_4_ + 1) * nxyz
                                        ) * 8),_n + nxyz);
              }
              for (status = 0; status < ref_private_macro_code_rxs + scalar_local._4_4_ + -1;
                  status = status + 1) {
                fprintf((FILE *)ref_mpi,"%.15e%s",
                        *(undefined8 *)
                         (global + (long)(status + (ref_private_macro_code_rxs + scalar_local._4_4_
                                                   + 1) * nxyz) * 8),pcStack_30);
              }
              if (0 < scalar_local._4_4_) {
                fprintf((FILE *)ref_mpi,"%.15e\n",
                        *(undefined8 *)
                         (global + (long)(ref_private_macro_code_rxs + scalar_local._4_4_ + -1 +
                                         (ref_private_macro_code_rxs + scalar_local._4_4_ + 1) *
                                         nxyz) * 8));
              }
            }
          }
        }
        if (global != 0) {
          free((void *)global);
        }
        if (xyzm != (REF_DBL *)0x0) {
          free(xyzm);
        }
        ref_node_local._4_4_ = 0;
      }
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_scalar_txt(
    REF_NODE ref_node, REF_INT ldim, REF_DBL *scalar, const char *separator,
    REF_BOOL prepend_xyz, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB global, nnode_written, first;
  REF_INT local, n, i, im, nxyz;
  REF_STATUS status;

  nxyz = 0;
  if (prepend_xyz) nxyz = 3;

  chunk = (REF_INT)(ref_node_n_global(ref_node) / ref_mpi_n(ref_mpi) + 1);
  chunk =
      MIN(chunk, ref_mpi_reduce_chunk_limit(
                     ref_mpi, (nxyz + ldim + 1) * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, (nxyz + ldim + 1) * chunk, REF_DBL);
  ref_malloc(xyzm, (nxyz + ldim + 1) * chunk, REF_DBL);

  nnode_written = 0;
  while (nnode_written < ref_node_n_global(ref_node)) {
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk,
                     ref_node_n_global(ref_node) - nnode_written);

    nnode_written += n;

    for (i = 0; i < (nxyz + ldim + 1) * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_node_local(ref_node, global, &local);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status &&
          ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, local)) {
        for (im = 0; im < nxyz; im++)
          local_xyzm[im + (nxyz + ldim + 1) * i] =
              ref_node_xyz(ref_node, im, local);
        for (im = 0; im < ldim; im++)
          local_xyzm[nxyz + im + (nxyz + ldim + 1) * i] =
              scalar[im + ldim * local];
        local_xyzm[nxyz + ldim + (nxyz + ldim + 1) * i] = 1.0;
      } else {
        for (im = 0; im < (nxyz + ldim + 1); im++)
          local_xyzm[im + (nxyz + ldim + 1) * i] = 0.0;
      }
    }

    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, (nxyz + ldim + 1) * n,
                    REF_DBL_TYPE),
        "sum");

    if (ref_mpi_once(ref_mpi))
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[nxyz + ldim + (nxyz + ldim + 1) * i] - 1.0) > 0.1) {
          printf("error gather node " REF_GLOB_FMT " %f\n", first + i,
                 xyzm[nxyz + ldim + (nxyz + ldim + 1) * i]);
        }
        for (im = 0; im < nxyz + ldim - 1; im++) {
          fprintf(file, "%.15e%s", xyzm[im + (nxyz + ldim + 1) * i], separator);
        }
        if (ldim > 0)
          fprintf(file, "%.15e\n",
                  xyzm[(nxyz + ldim - 1) + (nxyz + ldim + 1) * i]);
      }
  }

  ref_free(xyzm);
  ref_free(local_xyzm);

  return REF_SUCCESS;
}